

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sscSat.c
# Opt level: O1

void Ssc_ManCollectSatPattern(Ssc_Man_t *p,Vec_Int_t *vPattern)

{
  int iVar1;
  Gia_Man_t *pGVar2;
  Vec_Int_t *pVVar3;
  long lVar4;
  
  vPattern->nSize = 0;
  pGVar2 = p->pFraig;
  pVVar3 = pGVar2->vCis;
  if (0 < pVVar3->nSize) {
    lVar4 = 0;
    do {
      iVar1 = pVVar3->pArray[lVar4];
      if (((long)iVar1 < 0) || (pGVar2->nObjs <= iVar1)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (pGVar2->pObjs == (Gia_Obj_t *)0x0) {
        return;
      }
      if (p->vId2Var->nSize <= iVar1) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar1 = p->vId2Var->pArray[iVar1];
      if (((long)iVar1 < 0) || (p->pSat->size <= iVar1)) {
        __assert_fail("v >= 0 && v < s->size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.h"
                      ,0xda,"int sat_solver_var_value(sat_solver *, int)");
      }
      Vec_IntPush(vPattern,(uint)(p->pSat->model[iVar1] == 1));
      lVar4 = lVar4 + 1;
      pGVar2 = p->pFraig;
      pVVar3 = pGVar2->vCis;
    } while (lVar4 < pVVar3->nSize);
  }
  return;
}

Assistant:

void Ssc_ManCollectSatPattern( Ssc_Man_t * p, Vec_Int_t * vPattern )
{
    Gia_Obj_t * pObj;
    int i;
    Vec_IntClear( vPattern );
    Gia_ManForEachCi( p->pFraig, pObj, i )
        Vec_IntPush( vPattern, sat_solver_var_value(p->pSat, Ssc_ObjSatVar(p, Gia_ObjId(p->pFraig, pObj))) );
}